

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

void Gia_ManQuantSetSuppCi(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong *puVar1;
  Gia_Obj_t *pGVar2;
  Vec_Wrd_t *p_00;
  word *pwVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Wrd_t *__ptr;
  long lVar7;
  int iVar8;
  
  if ((~*(uint *)pObj & 0x9fffffff) != 0) {
    __assert_fail("Gia_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                  ,0x77,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
  }
  __ptr = p->vSuppWords;
  if (__ptr == (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vSuppWords != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                  ,0x78,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar6 = p->iSuppPi;
  if (iVar6 == p->nSuppWords << 6) {
    iVar6 = __ptr->nSize;
    iVar8 = 1000;
    if (iVar6 != 0) {
      iVar8 = iVar6 * 2;
    }
    p_00 = (Vec_Wrd_t *)malloc(0x10);
    iVar4 = 0x10;
    if (0xe < iVar8 - 1U) {
      iVar4 = iVar8;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar4;
    if (iVar4 == 0) {
      pwVar3 = (word *)0x0;
    }
    else {
      pwVar3 = (word *)malloc((long)iVar4 << 3);
    }
    p_00->pArray = pwVar3;
    if (0 < iVar6) {
      lVar7 = 0;
      iVar6 = 0;
      do {
        Vec_WrdPush(p_00,__ptr->pArray[lVar7]);
        iVar6 = iVar6 + 1;
        if (iVar6 == p->nSuppWords) {
          iVar6 = 0;
          Vec_WrdPush(p_00,0);
        }
        lVar7 = lVar7 + 1;
        __ptr = p->vSuppWords;
      } while (lVar7 < __ptr->nSize);
    }
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    p->vSuppWords = p_00;
    iVar6 = p->nSuppWords + 1;
    p->nSuppWords = iVar6;
    if (p_00->nSize != iVar6 * p->nObjs) {
      __assert_fail("Vec_WrdSize(p->vSuppWords) == p->nSuppWords * Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                    ,0x89,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar6 = p->iSuppPi;
  }
  if (iVar6 != (p->vSuppVars).nSize) {
    __assert_fail("p->iSuppPi == Vec_IntSize(&p->vSuppVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                  ,0x8c,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((int)*(undefined8 *)pObj < 0) {
    Vec_IntPush(&p->vSuppVars,(uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff);
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar5 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * p->nSuppWords * -0x55555555;
    if ((-1 < (int)uVar5) && ((int)uVar5 < p->vSuppWords->nSize)) {
      pwVar3 = p->vSuppWords->pArray;
      iVar6 = p->iSuppPi;
      p->iSuppPi = iVar6 + 1;
      puVar1 = pwVar3 + (ulong)uVar5 + (long)(iVar6 >> 6);
      *puVar1 = *puVar1 | 1L << ((byte)iVar6 & 0x3f);
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                  ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  __assert_fail("pObj->fTerm",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                ,0x1d5,"int Gia_ObjCioId(Gia_Obj_t *)");
}

Assistant:

void Gia_ManQuantSetSuppCi( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCi(pObj) );
    assert( p->vSuppWords != NULL );
    if ( p->iSuppPi == 64 * p->nSuppWords )
    {
        word Data; int w, Count = 0, Size = Vec_WrdSize(p->vSuppWords);
        Vec_Wrd_t * vTemp = Vec_WrdAlloc( Size ? 2 * Size : 1000 ); 
        Vec_WrdForEachEntry( p->vSuppWords, Data, w )
        {
            Vec_WrdPush( vTemp, Data );
            if ( ++Count == p->nSuppWords )
            {
                Vec_WrdPush( vTemp, 0 );
                Count = 0;
            }
        }
        Vec_WrdFree( p->vSuppWords );
        p->vSuppWords = vTemp;
        p->nSuppWords++;
        assert( Vec_WrdSize(p->vSuppWords) == p->nSuppWords * Gia_ManObjNum(p) );
        //printf( "Resizing to %d words.\n", p->nSuppWords );
    }
    assert( p->iSuppPi == Vec_IntSize(&p->vSuppVars) );
    Vec_IntPush( &p->vSuppVars, Gia_ObjCioId(pObj) );
    Abc_TtSetBit( Gia_ManQuantInfo(p, pObj), p->iSuppPi++ );
}